

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_undo.cpp
# Opt level: O2

bool handler_selective_new_allowed_proc
               (Am_Object *command_obj,Am_Value *new_selection,Am_Value *new_value)

{
  Am_Selective_New_Allowed_Method_Type *pAVar1;
  bool bVar2;
  bool bVar3;
  Am_Value *pAVar4;
  undefined8 in_RCX;
  anon_union_8_8_ea4c8939_for_value in_R8;
  Am_Value AVar5;
  Am_Value AVar6;
  Am_Value value;
  Am_Object local_80;
  Am_Value *local_78;
  Am_Value *local_70;
  Am_Selective_Repeat_New_Method method;
  Am_Selective_New_Allowed_Method allowed_method;
  undefined1 local_48 [16];
  Am_Value local_38;
  
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  allowed_method.from_wrapper = (Am_Method_Wrapper *)0x0;
  allowed_method.Call = (Am_Selective_New_Allowed_Method_Type *)0x0;
  local_78 = new_value;
  local_70 = new_selection;
  while( true ) {
    bVar2 = Am_Object::Valid(command_obj);
    if (!bVar2) break;
    pAVar4 = Am_Object::Get(command_obj,0x14d,4);
    Am_Selective_New_Allowed_Method::operator=(&allowed_method,pAVar4);
    pAVar1 = allowed_method.Call;
    if (allowed_method.Call != (Am_Selective_New_Allowed_Method_Type *)0x0) {
      Am_Object::Am_Object(&local_80,command_obj);
      Am_Value::Am_Value(&local_38,local_70);
      Am_Value::Am_Value((Am_Value *)local_48,local_78);
      AVar5.value.wrapper_value = (Am_Wrapper *)local_48;
      AVar5._0_8_ = &local_38;
      AVar6.value.wrapper_value = in_R8.wrapper_value;
      AVar6._0_8_ = in_RCX;
      bVar2 = (*pAVar1)((Am_Object_Data *)&local_80,AVar5,AVar6);
      Am_Value::~Am_Value((Am_Value *)local_48);
      Am_Value::~Am_Value(&local_38);
      Am_Object::~Am_Object(&local_80);
      if (!bVar2) break;
    }
    method.from_wrapper = (Am_Method_Wrapper *)0x0;
    method.Call = (Am_Selective_Repeat_New_Method_Type *)0x0;
    pAVar4 = Am_Object::Get(command_obj,0x14a,4);
    Am_Selective_Repeat_New_Method::operator=(&method,pAVar4);
    bVar2 = method.Call != (Am_Selective_Repeat_New_Method_Type *)0x0;
    if (bVar2) goto LAB_001cb45a;
    pAVar4 = Am_Object::Get(command_obj,0x167,5);
    Am_Value::operator=(&value,pAVar4);
    bVar3 = Am_Value::Valid(&value);
    in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),value.type == 0xa001);
    if (!bVar3 || value.type != 0xa001) goto LAB_001cb45a;
    Am_Object::operator=(command_obj,&value);
  }
  bVar2 = false;
LAB_001cb45a:
  Am_Value::~Am_Value(&value);
  return bVar2;
}

Assistant:

Am_Define_Method(Am_Selective_New_Allowed_Method, bool,
                 handler_selective_new_allowed,
                 (Am_Object command_obj, Am_Value new_selection,
                  Am_Value new_value))
{
  Am_Selective_New_Allowed_Method allowed_method;
  Am_Value value;
  while (true) {
    if (!command_obj.Valid())
      return false;
    allowed_method =
        command_obj.Get(Am_SELECTIVE_REPEAT_NEW_ALLOWED, Am_NO_DEPENDENCY);
    if (allowed_method.Valid())
      if (!(allowed_method.Call(command_obj, new_selection, new_value)))
        return false;
    Am_Selective_Repeat_New_Method method;
    method =
        command_obj.Get(Am_SELECTIVE_REPEAT_ON_NEW_METHOD, Am_NO_DEPENDENCY);
    if (method.Valid())
      return true;
    value = command_obj.Peek(Am_IMPLEMENTATION_CHILD, Am_NO_DEPENDENCY);
    if (value.Valid() && value.type == Am_OBJECT)
      command_obj = value;
    else
      return false;
  }
}